

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

void __thiscall fasttext::Args::printTrainingHelp(Args *this)

{
  ostream *poVar1;
  char *pcVar2;
  string sStack_58;
  string local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "\nThe following arguments for training are optional:\n");
  std::operator<<(poVar1,"  -lr                 learning rate [");
  poVar1 = std::ostream::_M_insert<double>(this->lr);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,
                           "  -lrUpdateRate       change the rate of updates for the learning rate ["
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->lrUpdateRate);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -dim                size of word vectors [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->dim);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -ws                 size of the context window [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->ws);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -epoch              number of epochs [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->epoch);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -neg                number of negatives sampled [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->neg);
  poVar1 = std::operator<<(poVar1,"]\n");
  pcVar2 = "  -loss               loss function {ns, hs, softmax, one-vs-all} [";
  poVar1 = std::operator<<(poVar1,
                           "  -loss               loss function {ns, hs, softmax, one-vs-all} [");
  lossToString_abi_cxx11_(&local_38,(Args *)pcVar2,this->loss);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -thread             number of threads [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->thread);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,
                           "  -pretrainedVectors  pretrained word vectors for supervised learning ["
                          );
  poVar1 = std::operator<<(poVar1,(string *)&this->pretrainedVectors);
  poVar1 = std::operator<<(poVar1,"]\n");
  pcVar2 = "  -saveOutput         whether output params should be saved [";
  poVar1 = std::operator<<(poVar1,"  -saveOutput         whether output params should be saved [");
  boolToString_abi_cxx11_(&sStack_58,(Args *)pcVar2,this->saveOutput);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_58);
  std::operator<<(poVar1,"]\n");
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Args::printTrainingHelp() {
  std::cerr
      << "\nThe following arguments for training are optional:\n"
      << "  -lr                 learning rate [" << lr << "]\n"
      << "  -lrUpdateRate       change the rate of updates for the learning rate ["
      << lrUpdateRate << "]\n"
      << "  -dim                size of word vectors [" << dim << "]\n"
      << "  -ws                 size of the context window [" << ws << "]\n"
      << "  -epoch              number of epochs [" << epoch << "]\n"
      << "  -neg                number of negatives sampled [" << neg << "]\n"
      << "  -loss               loss function {ns, hs, softmax, one-vs-all} ["
      << lossToString(loss) << "]\n"
      << "  -thread             number of threads [" << thread << "]\n"
      << "  -pretrainedVectors  pretrained word vectors for supervised learning ["
      << pretrainedVectors << "]\n"
      << "  -saveOutput         whether output params should be saved ["
      << boolToString(saveOutput) << "]\n";
}